

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O2

int32_t __thiscall
icu_63::SpoofData::serialize(SpoofData *this,void *buf,int32_t capacity,UErrorCode *status)

{
  int iVar1;
  
  iVar1 = this->fRawData->fLength;
  if (capacity < iVar1) {
    *status = U_BUFFER_OVERFLOW_ERROR;
  }
  else {
    memcpy(buf,this->fRawData,(long)iVar1);
  }
  return iVar1;
}

Assistant:

int32_t SpoofData::serialize(void *buf, int32_t capacity, UErrorCode &status) const {
    int32_t dataSize = fRawData->fLength;
    if (capacity < dataSize) {
        status = U_BUFFER_OVERFLOW_ERROR;
        return dataSize;
    }
    uprv_memcpy(buf, fRawData, dataSize);
    return dataSize;
}